

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O2

QStyleOptionSizeGrip * qstyleoption_cast<QStyleOptionSizeGrip_const*>(QStyleOption *opt)

{
  if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 0xf0007)) {
    opt = (QStyleOption *)0x0;
  }
  return (QStyleOptionSizeGrip *)opt;
}

Assistant:

T qstyleoption_cast(const QStyleOption *opt)
{
    typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type Opt;
    if (opt && opt->version >= Opt::Version && (opt->type == Opt::Type
        || int(Opt::Type) == QStyleOption::SO_Default
        || (int(Opt::Type) == QStyleOption::SO_Complex
            && opt->type > QStyleOption::SO_Complex)))
        return static_cast<T>(opt);
    return nullptr;
}